

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  CapTableReader *pCVar4;
  Arena *pAVar5;
  word *pwVar6;
  size_t sVar7;
  ReadLimiter *pRVar8;
  char cVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  ElementSize EVar12;
  uint uVar13;
  SegmentReader **ppSVar14;
  StructDataBitCount SVar15;
  ulong uVar16;
  ulong uVar17;
  SegmentBuilder **ppSVar18;
  OrphanBuilder *pOVar19;
  SegmentReader **ppSVar20;
  uint uVar21;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  ulong uVar22;
  bool bVar23;
  SegmentReader *newSegment;
  StructDataBitCount local_7c;
  SegmentBuilder *local_78;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
  local_78 = this->segment;
  pCVar4 = &this->capTable->super_CapTableReader;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && (int)(this->tag).content == 0)
  goto LAB_001279b6;
  ppSVar18 = (SegmentBuilder **)this->location;
  pOVar19 = this;
  if ((local_78 != (SegmentBuilder *)0x0) && (((this->tag).content & 3) == 2)) {
    pAVar5 = (local_78->super_SegmentReader).arena;
    iVar10 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)*(uint *)((long)&(this->tag).content + 4));
    local_78 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    _kjCondition.left = (SegmentReader **)&local_78;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_78 != (SegmentBuilder *)0x0;
    if (local_78 == (SegmentBuilder *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar13 = (uint)(this->tag).content;
      uVar22 = (ulong)(uVar13 >> 3);
      uVar17 = (local_78->super_SegmentReader).ptr.size_;
      if ((long)uVar17 < (long)uVar22) {
        uVar22 = uVar17;
      }
      pOVar19 = (OrphanBuilder *)((local_78->super_SegmentReader).ptr.ptr + uVar22);
      if (local_78 == (SegmentBuilder *)0x0) {
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_00127705:
        if (((this->tag).content & 4) == 0) {
          ppSVar1 = &pOVar19->segment;
          lVar11 = (long)((int)(pOVar19->tag).content >> 2);
          if (local_78 == (SegmentBuilder *)0x0) {
            ppSVar18 = ppSVar1 + lVar11;
          }
          else {
            pwVar6 = (local_78->super_SegmentReader).ptr.ptr;
            ppSVar18 = (SegmentBuilder **)(pwVar6 + (local_78->super_SegmentReader).ptr.size_);
            if (((long)pwVar6 - (long)ppSVar1 >> 3 <= lVar11) &&
               (lVar11 <= (long)ppSVar18 - (long)ppSVar1 >> 3)) {
              ppSVar18 = ppSVar1 + lVar11;
            }
          }
          goto LAB_001278d1;
        }
        pAVar5 = (local_78->super_SegmentReader).arena;
        iVar10 = (*pAVar5->_vptr_Arena[2])
                           (pAVar5,(ulong)*(uint *)((long)&(pOVar19->tag).content + 4));
        newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
        _kjCondition.right = (void *)0x0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
        if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
          _kjCondition.left = &newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x25f,FAILED,"newSegment != nullptr",
                     "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                     &_kjCondition,
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_001278be:
          ppSVar18 = (SegmentBuilder **)0x0;
          kj::_::Debug::Fault::~Fault(&f_2);
        }
        else {
          uVar13 = (uint)(pOVar19->tag).content & 3;
          _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar13);
          _kjCondition.right = anon_var_dwarf_1d86e;
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = (size_t)(uVar13 == 2);
          if (uVar13 != 2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
            goto LAB_001278be;
          }
          uVar17 = (ulong)((uint)(pOVar19->tag).content >> 3);
          sVar7 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
          if ((long)sVar7 < (long)uVar17) {
            uVar17 = sVar7;
          }
          ppSVar18 = (SegmentBuilder **)
                     ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar17);
          local_78 = (SegmentBuilder *)newSegment;
        }
        pOVar19 = (OrphanBuilder *)&pOVar19->segment;
        goto LAB_001278d1;
      }
      uVar16 = 2 - (ulong)((uVar13 & 4) == 0);
      if (uVar17 < uVar22 + uVar16) {
        newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
      }
      else {
        pRVar8 = (local_78->super_SegmentReader).readLimiter;
        uVar17 = pRVar8->limit;
        if (uVar17 < uVar16) {
          (*((local_78->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        else {
          pRVar8->limit = uVar17 - uVar16;
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar16 <= uVar17);
        if (uVar16 <= uVar17) goto LAB_00127705;
      }
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
    ppSVar18 = (SegmentBuilder **)0x0;
    pOVar19 = this;
  }
LAB_001278d1:
  if (ppSVar18 == (SegmentBuilder **)0x0) {
    cVar9 = (ppSVar18 == (SegmentBuilder **)0x0) * '\x02';
  }
  else {
    uVar13 = (uint)(pOVar19->tag).content & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar13);
    _kjCondition.right = anon_var_dwarf_1d86e;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar13 == 1);
    if (uVar13 == 1) {
      uVar13 = *(uint *)((long)&(pOVar19->tag).content + 4);
      EVar12 = (ElementSize)uVar13 & INLINE_COMPOSITE;
      if (EVar12 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar13 >> 3;
        if (local_78 == (SegmentBuilder *)0x0) {
          bVar23 = true;
        }
        else if ((local_78->super_SegmentReader).ptr.size_ <
                 ((long)ppSVar18 - (long)(local_78->super_SegmentReader).ptr.ptr >> 3) +
                 (ulong)(uint)f_2.exception + 1) {
          bVar23 = false;
        }
        else {
          uVar22 = (ulong)(uint)f_2.exception + 1;
          pRVar8 = (local_78->super_SegmentReader).readLimiter;
          uVar17 = pRVar8->limit;
          bVar23 = uVar17 >= uVar22;
          if (uVar17 < uVar22) {
            (*((local_78->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          else {
            pRVar8->limit = uVar17 - uVar22;
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar23);
        if (bVar23 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar9 = '\x02';
        }
        else {
          uVar13 = *(uint *)ppSVar18 & 3;
          _kjCondition.left = (SegmentReader **)(ulong)uVar13;
          _kjCondition.right = anon_var_dwarf_1d86e;
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar13 == 0);
          if (uVar13 == 0) {
            uVar21 = *(uint *)ppSVar18 >> 2 & 0x1fffffff;
            uVar17 = (ulong)uVar21;
            uVar13 = (uint)*(ushort *)((long)ppSVar18 + 6) + (uint)*(ushort *)((long)ppSVar18 + 4);
            ppSVar14 = (SegmentReader **)(uVar13 * uVar17);
            _kjCondition.right = &f_2;
            ppSVar20 = (SegmentReader **)(ulong)(uint)f_2.exception;
            cVar9 = '\0';
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar23 = (long)ppSVar14 - (long)ppSVar20 == 0;
            _kjCondition.result = ppSVar14 < ppSVar20 || bVar23;
            _kjCondition.left = ppSVar14;
            if (ppSVar14 >= ppSVar20 && !bVar23) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount"
                         ,
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              cVar9 = '\x02';
            }
            if (ppSVar14 < ppSVar20 || (long)ppSVar14 - (long)ppSVar20 == 0) {
              if (uVar13 == 0) {
                if (local_78 == (SegmentBuilder *)0x0) {
                  bVar23 = true;
                }
                else {
                  pRVar8 = (local_78->super_SegmentReader).readLimiter;
                  uVar22 = pRVar8->limit;
                  bVar23 = uVar22 >= uVar17;
                  if (uVar22 < uVar17) {
                    (*((local_78->super_SegmentReader).arena)->_vptr_Arena[3])();
                  }
                  else {
                    pRVar8->limit = uVar22 - uVar17;
                  }
                }
                newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar23);
                if (bVar23 == false) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x917,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))"
                             ,"_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&newSegment,
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                  cVar9 = '\x02';
                  goto LAB_001279b1;
                }
              }
              uVar2 = *(ushort *)((long)ppSVar18 + 4);
              SVar3 = *(StructPointerCount *)((long)ppSVar18 + 6);
              __return_storage_ptr__->segment = &local_78->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar4;
              __return_storage_ptr__->ptr = (byte *)(ppSVar18 + 1);
              __return_storage_ptr__->elementCount = uVar21;
              __return_storage_ptr__->step = uVar13 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = SVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
              goto LAB_00127e6a;
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      ((Fault *)&newSegment,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
            cVar9 = '\x02';
          }
        }
      }
      else {
        SVar15 = (&BITS_PER_ELEMENT_TABLE)[EVar12];
        uVar17 = (ulong)(uVar13 >> 3);
        uVar21 = (uint)(EVar12 == POINTER) * 0x40 + SVar15;
        if (local_78 == (SegmentBuilder *)0x0) {
          bVar23 = true;
        }
        else {
          uVar22 = uVar21 * uVar17 + 0x3f >> 6 & 0xffffffff;
          if ((local_78->super_SegmentReader).ptr.size_ <
              ((long)ppSVar18 - (long)(local_78->super_SegmentReader).ptr.ptr >> 3) + uVar22) {
            bVar23 = false;
          }
          else {
            pRVar8 = (local_78->super_SegmentReader).readLimiter;
            uVar16 = pRVar8->limit;
            bVar23 = uVar16 >= uVar22;
            if (uVar16 < uVar22) {
              local_7c = SVar15;
              (*((local_78->super_SegmentReader).arena)->_vptr_Arena[3])();
              SVar15 = local_7c;
            }
            else {
              pRVar8->limit = uVar16 - uVar22;
            }
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar23);
        if (bVar23 == false) {
          local_7c = SVar15;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar9 = '\x02';
        }
        else if (EVar12 == BIT) {
LAB_00127d52:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x969,FAILED,(char *)0x0,
                     "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])0x18926a);
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar9 = '\x02';
        }
        else {
          if ((uVar13 & 7) == 0) {
            if (local_78 == (SegmentBuilder *)0x0) {
              bVar23 = true;
            }
            else {
              pRVar8 = (local_78->super_SegmentReader).readLimiter;
              uVar22 = pRVar8->limit;
              bVar23 = uVar22 >= uVar17;
              if (uVar22 < uVar17) {
                local_7c = SVar15;
                (*((local_78->super_SegmentReader).arena)->_vptr_Arena[3])();
                SVar15 = local_7c;
              }
              else {
                pRVar8->limit = uVar22 - uVar17;
              }
            }
            newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar23);
            if (bVar23 == false) {
              local_7c = SVar15;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x960,FAILED,
                         "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                         "_kjCondition,\"Message contains amplified list pointer.\"",
                         (DebugExpression<bool> *)&newSegment,
                         (char (*) [41])"Message contains amplified list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
              cVar9 = '\x02';
              goto LAB_001279b1;
            }
            if (EVar12 == BIT) goto LAB_00127d52;
          }
          __return_storage_ptr__->segment = &local_78->super_SegmentReader;
          __return_storage_ptr__->capTable = pCVar4;
          __return_storage_ptr__->ptr = (byte *)ppSVar18;
          __return_storage_ptr__->elementCount = uVar13 >> 3;
          __return_storage_ptr__->step = uVar21;
          __return_storage_ptr__->structDataSize = SVar15;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar12 == POINTER);
          __return_storage_ptr__->elementSize = EVar12;
LAB_00127e6a:
          __return_storage_ptr__->nestingLimit = 0x7ffffffe;
          cVar9 = '\x01';
        }
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
      cVar9 = '\x02';
    }
  }
LAB_001279b1:
  if (cVar9 != '\x02') {
    return __return_storage_ptr__;
  }
LAB_001279b6:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}